

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall AGSSock::Buffer::extract(Buffer *this)

{
  reference pvVar1;
  long lVar2;
  ulong uVar3;
  size_t pos;
  string *buffer;
  Buffer *this_local;
  
  pvVar1 = std::
           queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::front(&this->queue_);
  lVar2 = std::__cxx11::string::find_first_of((char)pvVar1,0);
  if (lVar2 == -1) {
    std::
    queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pop(&this->queue_);
  }
  else {
    std::__cxx11::string::find_first_not_of((char)pvVar1,0);
    std::__cxx11::string::erase((ulong)pvVar1,0);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::
      queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pop(&this->queue_);
    }
  }
  return;
}

Assistant:

void Buffer::extract()
{
	// Not checked for empty
	string &buffer = queue_.front();
	size_t pos = buffer.find_first_of('\0');
	if (pos == string::npos)
		queue_.pop();
	else
	{
		pos = buffer.find_first_not_of('\0', pos);
		buffer.erase(0, pos);
		// Empty strings should only be generated by the sockets API
		if (buffer.empty())
			queue_.pop();
	}
}